

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

bool __thiscall
viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::deep_equal
          (rt_variable<viennamath::rt_expression_interface<double>_> *this,
          rt_expression_interface<double> *other)

{
  id_type iVar1;
  rt_variable<viennamath::rt_expression_interface<double>_> *local_40;
  self_type *ptr;
  rt_expression_interface<double> *other_local;
  rt_variable<viennamath::rt_expression_interface<double>_> *this_local;
  
  if (other == (rt_expression_interface<double> *)0x0) {
    local_40 = (rt_variable<viennamath::rt_expression_interface<double>_> *)0x0;
  }
  else {
    local_40 = (rt_variable<viennamath::rt_expression_interface<double>_> *)
               __dynamic_cast(other,&rt_expression_interface<double>::typeinfo,
                              &rt_variable<viennamath::rt_expression_interface<double>>::typeinfo,0)
    ;
  }
  if (local_40 == (rt_variable<viennamath::rt_expression_interface<double>_> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar1 = id(local_40);
    this_local._7_1_ = iVar1 == this->id_;
  }
  return this_local._7_1_;
}

Assistant:

bool deep_equal(const InterfaceType * other) const
      {
        const self_type * ptr = dynamic_cast< const self_type *>(other);
        if (ptr != NULL)
          return ptr->id() == id_;

        return false;
      }